

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.cpp
# Opt level: O2

string * __thiscall pbrt::RNG::ToString_abi_cxx11_(string *__return_storage_ptr__,RNG *this)

{
  unsigned_long *in_R8;
  
  StringPrintf<unsigned_long_const&,unsigned_long_const&>
            (__return_storage_ptr__,(pbrt *)"[ RNG state: %lu inc: %lu ]",(char *)this,&this->inc,
             in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string RNG::ToString() const {
    return StringPrintf("[ RNG state: %" PRIu64 " inc: %" PRIu64 " ]", state, inc);
}